

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
* vkt::sr::anon_unknown_0::makePixelOffsetsFunctor
            (MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
             *__return_storage_ptr__,GatherType gatherType,GatherArgs *gatherArgs,IVec2 *offsetRange
            )

{
  SinglePixelOffsets *this;
  DynamicSinglePixelOffsets *this_00;
  MultiplePixelOffsets *this_01;
  DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets> local_40;
  DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets> local_3f;
  DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets> local_3e;
  DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets> local_3d [13];
  Vector<int,_2> local_30;
  IVec2 offset;
  IVec2 *offsetRange_local;
  GatherArgs *gatherArgs_local;
  GatherType gatherType_local;
  
  offset.m_data = (int  [2])offsetRange;
  if ((gatherType == GATHERTYPE_BASIC) || (gatherType == GATHERTYPE_OFFSET)) {
    if (gatherType == GATHERTYPE_BASIC) {
      tcu::Vector<int,_2>::Vector(&local_30,0);
    }
    else {
      tcu::Vector<int,_2>::Vector(&local_30,gatherArgs->offsets);
    }
    this = (SinglePixelOffsets *)operator_new(0x28);
    SinglePixelOffsets::SinglePixelOffsets(this,&local_30);
    de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>::DefaultDeleter(local_3d);
    de::details::
    MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
    ::MovePtr(__return_storage_ptr__,this);
  }
  else if (gatherType == GATHERTYPE_OFFSET_DYNAMIC) {
    this_00 = (DynamicSinglePixelOffsets *)operator_new(0x10);
    DynamicSinglePixelOffsets::DynamicSinglePixelOffsets(this_00,(IVec2 *)offset.m_data);
    de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>::DefaultDeleter(&local_3e);
    de::details::
    MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
    ::MovePtr(__return_storage_ptr__,this_00);
  }
  else if (gatherType == GATHERTYPE_OFFSETS) {
    this_01 = (MultiplePixelOffsets *)operator_new(0x28);
    MultiplePixelOffsets::MultiplePixelOffsets
              (this_01,gatherArgs->offsets,gatherArgs->offsets + 1,gatherArgs->offsets + 2,
               gatherArgs->offsets + 3);
    de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>::DefaultDeleter(&local_3f);
    de::details::
    MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
    ::MovePtr(__return_storage_ptr__,this_01);
  }
  else {
    de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>::DefaultDeleter(&local_40);
    de::details::
    MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
    ::MovePtr(__return_storage_ptr__,0);
  }
  return __return_storage_ptr__;
}

Assistant:

static MovePtr<PixelOffsets> makePixelOffsetsFunctor (GatherType gatherType, const GatherArgs& gatherArgs, const IVec2& offsetRange)
{
	if (gatherType == GATHERTYPE_BASIC || gatherType == GATHERTYPE_OFFSET)
	{
		const IVec2 offset = gatherType == GATHERTYPE_BASIC ? IVec2(0) : gatherArgs.offsets[0];
		return MovePtr<PixelOffsets>(new SinglePixelOffsets(offset));
	}
	else if (gatherType == GATHERTYPE_OFFSET_DYNAMIC)
	{
		return MovePtr<PixelOffsets>(new DynamicSinglePixelOffsets(offsetRange));
	}
	else if (gatherType == GATHERTYPE_OFFSETS)
		return MovePtr<PixelOffsets>(new MultiplePixelOffsets(gatherArgs.offsets[0],
															  gatherArgs.offsets[1],
															  gatherArgs.offsets[2],
															  gatherArgs.offsets[3]));
	else
	{
		DE_ASSERT(false);
		return MovePtr<PixelOffsets>(DE_NULL);
	}
}